

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoftp.c
# Opt level: O0

int xmlNanoFTPQuit(void *ctx)

{
  size_t sVar1;
  ssize_t sVar2;
  int res;
  int len;
  char buf [200];
  xmlNanoFTPCtxtPtr ctxt;
  void *ctx_local;
  
  if ((ctx == (void *)0x0) || (*(int *)((long)ctx + 0x44) == -1)) {
    ctx_local._4_4_ = -1;
  }
  else {
    buf._192_8_ = ctx;
    snprintf((char *)&res,200,"QUIT\r\n");
    sVar1 = strlen((char *)&res);
    sVar2 = send(*(int *)(buf._192_8_ + 0x44),&res,(long)(int)sVar1,0);
    ctx_local._4_4_ = (int)sVar2;
    if (ctx_local._4_4_ < 0) {
      __xmlIOErr(9,0,"send failed");
    }
    else {
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int
xmlNanoFTPQuit(void *ctx) {
    xmlNanoFTPCtxtPtr ctxt = (xmlNanoFTPCtxtPtr) ctx;
    char buf[200];
    int len, res;

    if ((ctxt == NULL) || (ctxt->controlFd == INVALID_SOCKET)) return(-1);

    snprintf(buf, sizeof(buf), "QUIT\r\n");
    len = strlen(buf);
#ifdef DEBUG_FTP
    xmlGenericError(xmlGenericErrorContext, "%s", buf); /* Just to be consistent, even though we know it can't have a % in it */
#endif
    res = send(ctxt->controlFd, SEND_ARG2_CAST buf, len, 0);
    if (res < 0) {
	__xmlIOErr(XML_FROM_FTP, 0, "send failed");
	return(res);
    }
    return(0);
}